

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O3

void __thiscall Fl_Text_Buffer::replace(Fl_Text_Buffer *this,int start,int end,char *text)

{
  int iVar1;
  char *__ptr;
  long lVar2;
  int start_00;
  
  if (text != (char *)0x0) {
    start_00 = 0;
    if (0 < start) {
      start_00 = start;
    }
    if (this->mLength < end) {
      end = this->mLength;
    }
    if (0 < this->mNPredeleteProcs) {
      lVar2 = 0;
      do {
        (*this->mPredeleteProcs[lVar2])(start_00,end - start_00,this->mPredeleteCbArgs[lVar2]);
        lVar2 = lVar2 + 1;
      } while (lVar2 < this->mNPredeleteProcs);
    }
    __ptr = text_range(this,start_00,end);
    remove_(this,start_00,end);
    iVar1 = insert_(this,start_00,text);
    this->mCursorPosHint = iVar1 + start_00;
    if (0 < this->mNModifyProcs) {
      lVar2 = 0;
      do {
        (*this->mModifyProcs[lVar2])(start_00,iVar1,end - start_00,0,__ptr,this->mCbArgs[lVar2]);
        lVar2 = lVar2 + 1;
      } while (lVar2 < this->mNModifyProcs);
    }
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void Fl_Text_Buffer::replace(int start, int end, const char *text)
{
  // Range check...
  if (!text)
    return;
  if (start < 0)
    start = 0;
  if (end > mLength)
    end = mLength;

  IS_UTF8_ALIGNED2(this, (start))
  IS_UTF8_ALIGNED2(this, (end))
  IS_UTF8_ALIGNED(text)
  
  call_predelete_callbacks(start, end - start);
  const char *deletedText = text_range(start, end);
  remove_(start, end);
  int nInserted = insert_(start, text);
  mCursorPosHint = start + nInserted;
  call_modify_callbacks(start, end - start, nInserted, 0, deletedText);
  free((void *) deletedText);
}